

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

CBlockHeader * __thiscall CBlock::GetBlockHeader(CBlock *this)

{
  long lVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int32_t *in_RSI;
  CBlockHeader *in_RDI;
  long in_FS_OFFSET;
  CBlockHeader *block;
  CBlockHeader *pCVar12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar12 = in_RDI;
  CBlockHeader::CBlockHeader(in_RDI);
  in_RDI->nVersion = *in_RSI;
  uVar9 = *(undefined8 *)(in_RSI + 1);
  uVar10 = *(undefined8 *)(in_RSI + 3);
  uVar11 = *(undefined8 *)(in_RSI + 7);
  *(undefined8 *)((in_RDI->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)(in_RSI + 5);
  *(undefined8 *)((in_RDI->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar11;
  *(undefined8 *)(in_RDI->hashPrevBlock).super_base_blob<256U>.m_data._M_elems = uVar9;
  *(undefined8 *)((in_RDI->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 8) = uVar10;
  iVar2 = in_RSI[9];
  iVar3 = in_RSI[10];
  iVar4 = in_RSI[0xb];
  iVar5 = in_RSI[0xc];
  iVar6 = in_RSI[0xe];
  iVar7 = in_RSI[0xf];
  iVar8 = in_RSI[0x10];
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) = in_RSI[0xd];
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x14) = iVar6;
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) = iVar7;
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c) = iVar8;
  *(int32_t *)(in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems = iVar2;
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 4) = iVar3;
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) = iVar4;
  *(int32_t *)((in_RDI->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0xc) = iVar5;
  in_RDI->nTime = in_RSI[0x11];
  in_RDI->nBits = in_RSI[0x12];
  in_RDI->nNonce = in_RSI[0x13];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar12;
  }
  __stack_chk_fail();
}

Assistant:

CBlockHeader GetBlockHeader() const
    {
        CBlockHeader block;
        block.nVersion       = nVersion;
        block.hashPrevBlock  = hashPrevBlock;
        block.hashMerkleRoot = hashMerkleRoot;
        block.nTime          = nTime;
        block.nBits          = nBits;
        block.nNonce         = nNonce;
        return block;
    }